

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>::
ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler3>_>
                *this)

{
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  int opcode;
  LogicalExpr LVar2;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    ReadConstant(this,*pcVar1);
    break;
  default:
    TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x2148be);
    break;
  case 'o':
    opcode = ReadOpCode(this);
    LVar2 = ReadLogicalExpr(this,opcode);
    return LVar2;
  }
  return 0;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}